

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureCase::init(TextureCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  TextureType extraout_EAX;
  TextureType TVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  NotSupportedError *this_00;
  int y;
  long lVar7;
  EVP_PKEY_CTX *ctx_00;
  ulong uVar8;
  value_type_conflict4 *__val;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  value_type_conflict4 *__val_1;
  void *local_220;
  Random rnd;
  undefined1 local_1e8 [20];
  GLint maxTextureSize;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  ctx_00 = (EVP_PKEY_CTX *)&maxTextureSize;
  maxTextureSize = 0;
  iVar2 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(0xd33);
  if (maxTextureSize < 0x80) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    rnd.m_rnd._0_8_ = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&rnd,"GL_MAX_TEXTURE_SIZE must be at least ","");
    de::toString<int>(&local_1d0,&Stress::(anonymous_namespace)::TEST_TEXTURE_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                   &local_1d0);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1b0);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  RenderCase::init(&this->super_RenderCase,ctx_00);
  iVar2 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar5 = CONCAT44(extraout_var_00,iVar2);
  deRandom_init(&rnd.m_rnd,0x3039);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_textureID);
  (**(code **)(lVar5 + 0xb8))(0xde1);
  if (this->m_uploadType == UPLOAD_PBO) {
    (**(code **)(lVar5 + 0x6c8))(1,&this->m_pboID);
    (**(code **)(lVar5 + 0x40))(0x88ec,this->m_pboID);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TextureCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x438);
  }
  TVar4 = this->m_textureType;
  if (TVar4 == TEXTURE_DEPTH) {
    local_220 = operator_new(0x10000);
    memset(local_220,0,0x10000);
    pvVar9 = (void *)0x0;
    if (this->m_uploadType == UPLOAD_CLIENT) {
      pvVar9 = local_220;
    }
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Creating a 2D depth texture and filling it with special floating point values.\n",
               0x4f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"  TEXTURE_COMPARE_MODE = COMPARE_REF_TO_TEXTURE",0x2f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    lVar6 = 0;
    pvVar11 = local_220;
    do {
      lVar10 = 0;
      do {
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  (&rnd,&Stress::(anonymous_namespace)::s_specialFloats,
                   (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE",(uint *)local_1b0,1);
        *(undefined4 *)((long)pvVar11 + lVar10 * 4) = local_1b0._0_4_;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      lVar6 = lVar6 + 1;
      pvVar11 = (void *)((long)pvVar11 + 0x200);
    } while (lVar6 != 0x80);
    if (this->m_uploadType == UPLOAD_PBO) {
      (**(code **)(lVar5 + 0x150))(0x88ec,0x10000,local_220,0x88e4);
    }
    (**(code **)(lVar5 + 0x1310))(0xde1,0,0x8cac,0x80,0x80,0,0x1902,0x1406,pvVar9);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x884c,0x884e);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x884d,0x201);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2601);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TextureCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x468);
    uVar8 = 0x10000;
  }
  else {
    if (TVar4 != TEXTURE_FLOAT) goto LAB_013b300b;
    local_220 = operator_new(0x20000);
    memset(local_220,0,0x20000);
    pvVar9 = (void *)0x0;
    if (this->m_uploadType == UPLOAD_CLIENT) {
      pvVar9 = local_220;
    }
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Creating a 2D 2-component float texture. Pixel contents are of form (special, 1).",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    lVar10 = (long)local_220 + 4;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  (&rnd,&Stress::(anonymous_namespace)::s_specialFloats,
                   (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE",(uint *)local_1b0,1);
        *(undefined4 *)(lVar10 + -4 + lVar7 * 8) = local_1b0._0_4_;
        *(undefined4 *)(lVar10 + lVar7 * 8) = 0x3f800000;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x80);
      lVar6 = lVar6 + 1;
      lVar10 = lVar10 + 0x400;
    } while (lVar6 != 0x80);
    if (this->m_uploadType == UPLOAD_PBO) {
      (**(code **)(lVar5 + 0x150))(0x88ec,0x20000,local_220,0x88e4);
    }
    (**(code **)(lVar5 + 0x1310))(0xde1,0,0x8230,0x80,0x80,0,0x8227,0x1406,pvVar9);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TextureCase::init",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                    ,0x450);
    uVar8 = 0x20000;
  }
  operator_delete(local_220,uVar8);
  TVar4 = extraout_EAX;
LAB_013b300b:
  if (this->m_uploadType == UPLOAD_PBO) {
    local_1b0._0_8_ =
         ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"PBO used for image upload.",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    (**(code **)(lVar5 + 0x40))(0x88ec,0);
    TVar4 = (**(code **)(lVar5 + 0x438))(1,&this->m_pboID);
    this->m_pboID = 0;
  }
  return TVar4;
}

Assistant:

void TextureCase::init (void)
{
	// requirements
	{
		GLint maxTextureSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
		if (maxTextureSize < TEST_TEXTURE_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_TEXTURE_SIZE));
	}

	RenderCase::init();

	// gen texture
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		de::Random				rnd			(12345);

		gl.genTextures(1, &m_textureID);
		gl.bindTexture(GL_TEXTURE_2D, m_textureID);

		if (m_uploadType == UPLOAD_PBO)
		{
			gl.genBuffers(1, &m_pboID);
			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_pboID);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}

		if (m_textureType == TEXTURE_FLOAT)
		{
			std::vector<deUint32>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE*2);
			const deUint32*			dataPtr = (m_uploadType == UPLOAD_CLIENT) ? (&texData[0]) : (DE_NULL);

			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a 2D 2-component float texture. Pixel contents are of form (special, 1)." << tcu::TestLog::EndMessage;

			// set green channel to 1.0
			for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
			for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
			{
				texData[(x * TEST_TEXTURE_SIZE + y) * 2 + 0] = rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				texData[(x * TEST_TEXTURE_SIZE + y) * 2 + 1] = 0x3F800000;	// one
			}

			if (m_uploadType == UPLOAD_PBO)
				gl.bufferData(GL_PIXEL_UNPACK_BUFFER, (glw::GLsizeiptr)(texData.size() * sizeof(deUint32)), &texData[0], GL_STATIC_DRAW);

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RG32F, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_RG, GL_FLOAT, dataPtr);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}
		else if (m_textureType == TEXTURE_DEPTH)
		{
			std::vector<deUint32>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE);
			const deUint32*			dataPtr = (m_uploadType == UPLOAD_CLIENT) ? (&texData[0]) : (DE_NULL);

			m_testCtx.getLog() << tcu::TestLog::Message
				<< "Creating a 2D depth texture and filling it with special floating point values.\n"
				<< "  TEXTURE_COMPARE_MODE = COMPARE_REF_TO_TEXTURE"
				<< tcu::TestLog::EndMessage;

			for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
			for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
				texData[x * TEST_TEXTURE_SIZE + y] = rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));

			if (m_uploadType == UPLOAD_PBO)
				gl.bufferData(GL_PIXEL_UNPACK_BUFFER, (glw::GLsizeiptr)(texData.size() * sizeof(deUint32)), &texData[0], GL_STATIC_DRAW);

			gl.texImage2D(GL_TEXTURE_2D, 0, GL_DEPTH_COMPONENT32F, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_DEPTH_COMPONENT, GL_FLOAT, dataPtr);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, GL_LESS);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureCase::init");
		}
		else
			DE_ASSERT(false);

		if (m_uploadType == UPLOAD_PBO)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "PBO used for image upload." << tcu::TestLog::EndMessage;

			gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);
			gl.deleteBuffers(1, &m_pboID);
			m_pboID = 0;
		}
	}
}